

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *other;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  LogMessage local_50;
  
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
             ,0x7a);
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::append((char *)&local_90);
  std::__cxx11::string::append((char *)&local_90);
  std::__cxx11::string::append((char *)&local_90);
  (*this->_vptr_MessageLite[2])(local_70,this);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__cxx11::string::append((char *)&local_90);
  (*this->_vptr_MessageLite[9])(local_70,this);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  other = internal::LogMessage::operator<<(&local_50,&local_90);
  internal::LogFinisher::operator=((LogFinisher *)local_70,other);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}